

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O2

void absl::lts_20250127::cord_internal::CordRep::Unref(CordRep *rep)

{
  bool bVar1;
  
  if (rep == (CordRep *)0x0) {
    __assert_fail("rep != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x397,"static void absl::cord_internal::CordRep::Unref(CordRep *)");
  }
  bVar1 = RefcountAndFlags::DecrementExpectHighRefcount(&rep->refcount);
  if (bVar1) {
    return;
  }
  Destroy(rep);
  return;
}

Assistant:

inline void CordRep::Unref(CordRep* rep) {
  assert(rep != nullptr);
  // Expect refcount to be 0. Avoiding the cost of an atomic decrement should
  // typically outweigh the cost of an extra branch checking for ref == 1.
  if (ABSL_PREDICT_FALSE(!rep->refcount.DecrementExpectHighRefcount())) {
    Destroy(rep);
  }
}